

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O2

CharMapper<unsigned_char> * gmlc::utilities::pairMapper(void)

{
  CharMapper<unsigned_char> *in_RDI;
  uchar ii;
  long lVar1;
  
  memset(in_RDI,0,0x100);
  for (lVar1 = 0; lVar1 != 0xff; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1] = (uchar)lVar1;
  }
  (in_RDI->key)._M_elems[0x28] = ')';
  (in_RDI->key)._M_elems[0x29] = '(';
  (in_RDI->key)._M_elems[0x3c] = '>';
  (in_RDI->key)._M_elems[0x5b] = ']';
  (in_RDI->key)._M_elems[0x7b] = '}';
  (in_RDI->key)._M_elems[0x3e] = '<';
  (in_RDI->key)._M_elems[0x5d] = '[';
  (in_RDI->key)._M_elems[0x7d] = '{';
  (in_RDI->key)._M_elems[2] = '\x03';
  (in_RDI->key)._M_elems[3] = '\x02';
  (in_RDI->key)._M_elems[0xe] = '\x0f';
  (in_RDI->key)._M_elems[0xf] = '\x0e';
  (in_RDI->key)._M_elems[0x11] = '\x13';
  (in_RDI->key)._M_elems[0x13] = '\x11';
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> pairMapper()
{
    CharMapper<unsigned char> dMap(0);
    for (unsigned char ii = 0; ii < 255; ++ii) {
        dMap.addKey(ii, ii);
    }
    dMap.addKey('(', ')');
    dMap.addKey('<', '>');
    dMap.addKey('[', ']');
    dMap.addKey('{', '}');
    dMap.addKey(')', '(');
    dMap.addKey('>', '<');
    dMap.addKey(']', '[');
    dMap.addKey('}', '{');
    dMap.addKey(0x02, 0x03);  // start of text, end of text
    dMap.addKey(0x03, 0x02);
    dMap.addKey(0x0E, 0x0F);  // XON, XOFF
    dMap.addKey(0x0F, 0x0E);
    dMap.addKey(0x11, 0x13);  // XON, XOFF
    dMap.addKey(0x13, 0x11);
    return dMap;
}